

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3DbRealloc(sqlite3 *db,void *p,u64 n)

{
  void *pvVar1;
  ulong in_RDX;
  void *in_RSI;
  u64 in_RDI;
  sqlite3 *unaff_retaddr;
  void *in_stack_fffffffffffffff8;
  
  if (in_RSI == (void *)0x0) {
    pvVar1 = sqlite3DbMallocRawNN((sqlite3 *)0x0,in_RDX);
    return pvVar1;
  }
  if (in_RSI < *(void **)(in_RDI + 0x1e8)) {
    if (in_RSI < *(void **)(in_RDI + 0x1d8)) {
      if ((*(void **)(in_RDI + 0x1e0) <= in_RSI) && (in_RDX <= *(ushort *)(in_RDI + 0x19e))) {
        return in_RSI;
      }
    }
    else if (in_RDX < 0x81) {
      return in_RSI;
    }
  }
  pvVar1 = dbReallocFinish(unaff_retaddr,in_stack_fffffffffffffff8,in_RDI);
  return pvVar1;
}

Assistant:

SQLITE_PRIVATE void *sqlite3DbRealloc(sqlite3 *db, void *p, u64 n){
  assert( db!=0 );
  if( p==0 ) return sqlite3DbMallocRawNN(db, n);
  assert( sqlite3_mutex_held(db->mutex) );
  if( ((uptr)p)<(uptr)db->lookaside.pEnd ){
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
    if( ((uptr)p)>=(uptr)db->lookaside.pMiddle ){
      if( n<=LOOKASIDE_SMALL ) return p;
    }else
#endif
    if( ((uptr)p)>=(uptr)db->lookaside.pStart ){
      if( n<=db->lookaside.szTrue ) return p;
    }
  }
  return dbReallocFinish(db, p, n);
}